

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool __thiscall
QDir::mkpath(QDir *this,QString *dirPath,optional<QFlags<QFileDevice::Permission>_> permissions)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  pointer pQVar5;
  undefined8 in_RDX;
  char *in_RDI;
  long in_FS_OFFSET;
  QDirPrivate *d;
  QString fn;
  QString *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff35;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  QString *in_stack_ffffffffffffff88;
  QDir *in_stack_ffffffffffffff90;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QDir *)0x28049d);
  bVar2 = QString::isEmpty((QString *)0x2804ac);
  if (bVar2) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               in_RDI,CONCAT13(in_stack_ffffffffffffff37,
                               CONCAT12(in_stack_ffffffffffffff36,
                                        CONCAT11(in_stack_ffffffffffffff35,in_stack_ffffffffffffff34
                                                ))),(char *)in_stack_ffffffffffffff28);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffff88,"QDir::mkpath: Empty or null file name");
    bVar3 = 0;
  }
  else {
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    filePath(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *
                       )0x280528);
    if (bVar2) {
      pQVar5 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::
               operator->((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                           *)0x2805d9);
      iVar4 = (*pQVar5->_vptr_QAbstractFileEngine[0xf])(pQVar5,&local_90,1,in_RDX);
      bVar3 = (byte)iVar4 & 1;
    }
    else {
      QFileSystemEntry::QFileSystemEntry
                ((QFileSystemEntry *)
                 CONCAT17(in_stack_ffffffffffffff37,
                          CONCAT16(in_stack_ffffffffffffff36,
                                   CONCAT15(in_stack_ffffffffffffff35,
                                            CONCAT14(in_stack_ffffffffffffff34,
                                                     in_stack_ffffffffffffff30)))),
                 in_stack_ffffffffffffff28);
      bVar3 = QFileSystemEngine::mkpath
                        ((QFileSystemEntry *)
                         CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                         (optional<QFlags<QFileDevice::Permission>_>)in_stack_ffffffffffffffd8);
      QFileSystemEntry::~QFileSystemEntry
                ((QFileSystemEntry *)
                 CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff36,
                                         CONCAT15(in_stack_ffffffffffffff35,
                                                  CONCAT14(in_stack_ffffffffffffff34,
                                                           in_stack_ffffffffffffff30)))));
    }
    QString::~QString((QString *)0x280629);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::mkpath(const QString &dirPath, std::optional<QFile::Permissions> permissions) const
{
    Q_D(const QDir);

    if (dirPath.isEmpty()) {
        qWarning("QDir::mkpath: Empty or null file name");
        return false;
    }

    QString fn = filePath(dirPath);
    if (!d->fileEngine)
        return QFileSystemEngine::mkpath(QFileSystemEntry(fn), permissions);
    return d->fileEngine->mkdir(fn, true, permissions);
}